

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

bool __thiscall JSON::getBool(JSON *this,bool *value)

{
  bool bVar1;
  element_type *peVar2;
  pointer pJVar3;
  long local_40;
  JSON_bool *v;
  bool *value_local;
  JSON *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    pJVar3 = std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::operator->
                       (&peVar2->value);
    if (pJVar3->type_code == vt_bool) {
      peVar2 = std::__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      pJVar3 = std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::get
                         (&peVar2->value);
      if (pJVar3 == (pointer)0x0) {
        local_40 = 0;
      }
      else {
        local_40 = __dynamic_cast(pJVar3,&JSON_value::typeinfo,&JSON_bool::typeinfo,0);
      }
      *value = (bool)(*(byte *)(local_40 + 0xc) & 1);
      return true;
    }
  }
  return false;
}

Assistant:

bool
JSON::getBool(bool& value) const
{
    if (m && m->value->type_code == vt_bool) {
        auto v = dynamic_cast<JSON_bool const*>(m->value.get());
        value = v->value;
        return true;
    }
    return false;
}